

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

Maybe<kj::Own<const_kj::File>_> __thiscall
kj::anon_unknown_35::InMemoryDirectory::asFile
          (InMemoryDirectory *this,Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *lock,
          EntryImpl *entry,WriteMode mode)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  FileNode *pFVar3;
  int iVar4;
  undefined4 in_register_0000000c;
  long lVar5;
  File *extraout_RDX;
  File *extraout_RDX_00;
  void *__child_stack;
  File *extraout_RDX_01;
  File *extraout_RDX_02;
  File *pFVar6;
  void *in_R8;
  OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
  *this_00;
  Maybe<kj::Own<const_kj::File>_> MVar7;
  PathPtr path;
  Path newPath;
  Array<kj::String> local_68;
  Own<kj::File> local_48;
  Own<const_kj::File> local_38;
  
  lVar5 = CONCAT44(in_register_0000000c,mode);
  iVar4 = *(int *)(lVar5 + 0x18);
  if (iVar4 == 0) {
    if (((ulong)in_R8 & 1) == 0) {
      _::Debug::Fault::Fault
                ((Fault *)&local_68,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x660,FAILED,"has(mode, WriteMode::CREATE)","");
      _::Debug::Fault::fatal((Fault *)&local_68);
    }
    this_00 = (OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
               *)(lVar5 + 0x18);
    puVar1 = (undefined8 *)(entry->name).content.size_;
    uVar2 = (*(code *)**(undefined8 **)*puVar1)();
    iVar4 = (int)lVar5;
    puVar1[7] = uVar2;
    newInMemoryFile((kj *)&local_48,*(Clock **)(entry->name).content.size_);
    local_38.disposer = local_48.disposer;
    local_38.ptr = local_48.ptr;
    local_48.ptr = (File *)0x0;
    pFVar3 = OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
             ::
             init<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,kj::(anonymous_namespace)::InMemoryDirectory::FileNode>
                       (this_00,(FileNode *)&local_38);
    File::clone((File *)&local_68,(__fn *)(pFVar3->file).ptr,__child_stack,iVar4,in_R8);
    (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
         (_func_int **)local_68.ptr;
    (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)local_68.size_;
    local_68.size_ = 0;
    Own<const_kj::File>::dispose((Own<const_kj::File> *)&local_68);
    Own<const_kj::File>::dispose(&local_38);
    Own<kj::File>::dispose(&local_48);
    pFVar6 = extraout_RDX_01;
  }
  else if (iVar4 == 3) {
    SymlinkNode::parse((Path *)&local_68,(SymlinkNode *)(lVar5 + 0x20));
    Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::release
              ((Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)entry);
    path.parts.size_ = (size_t)local_68.ptr;
    path.parts.ptr = (String *)lock;
    tryOpenFile(this,path,(WriteMode)local_68.size_);
    Array<kj::String>::~Array(&local_68);
    pFVar6 = extraout_RDX_00;
  }
  else if (iVar4 == 1) {
    File::clone((File *)&local_68,*(__fn **)(lVar5 + 0x28),entry,mode,in_R8);
    (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
         (_func_int **)local_68.ptr;
    (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)local_68.size_;
    local_68.size_ = 0;
    Own<const_kj::File>::dispose((Own<const_kj::File> *)&local_68);
    pFVar6 = extraout_RDX;
  }
  else {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[11]>
              ((Fault *)&local_68,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
               ,0x664,FAILED,(char *)0x0,"\"not a file\"",(char (*) [11])"not a file");
    (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode = (_func_int **)0x0;
    (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
    _::Debug::Fault::~Fault((Fault *)&local_68);
    pFVar6 = extraout_RDX_02;
  }
  MVar7.ptr.ptr = pFVar6;
  MVar7.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<const_kj::File>_>)MVar7.ptr;
}

Assistant:

Maybe<Own<const File>> asFile(kj::Locked<Impl>& lock, EntryImpl& entry, WriteMode mode) const {
    if (entry.node.is<FileNode>()) {
      return entry.node.get<FileNode>().file->clone();
    } else if (entry.node.is<SymlinkNode>()) {
      // CREATE_PARENT doesn't apply to creating the parents of a symlink target. However, the
      // target itself can still be created.
      auto newPath = entry.node.get<SymlinkNode>().parse();
      lock.release();
      return tryOpenFile(newPath, mode - WriteMode::CREATE_PARENT);
    } else if (entry.node == nullptr) {
      KJ_ASSERT(has(mode, WriteMode::CREATE));
      lock->modified();
      return entry.init(FileNode { newInMemoryFile(lock->clock) });
    } else {
      KJ_FAIL_REQUIRE("not a file") { return nullptr; }
    }
  }